

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gd_matrix.c
# Opt level: O2

int gdAffineInvert(double *dst,double *src)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  
  dVar6 = *src * src[3] - src[2] * src[1];
  if (0.0 < dVar6) {
    dVar5 = 1.0 / dVar6;
    dVar4 = src[3] * dVar5;
    *dst = dVar4;
    dVar1 = src[1];
    dst[1] = -dVar1 * dVar5;
    dVar2 = src[2];
    dst[2] = -dVar2 * dVar5;
    dVar3 = *src;
    dst[3] = dVar5 * dVar3;
    dst[4] = -src[4] * dVar4 - -dVar2 * dVar5 * src[5];
    dst[5] = -src[4] * -dVar1 * dVar5 - dVar5 * dVar3 * src[5];
  }
  return (uint)(0.0 < dVar6);
}

Assistant:

BGD_DECLARE(int) gdAffineInvert (double dst[6], const double src[6])
{
	double r_det = (src[0] * src[3] - src[1] * src[2]);

	if (r_det <= 0.0) {
		return GD_FALSE;
	}

	r_det = 1.0 / r_det;
	dst[0] = src[3] * r_det;
	dst[1] = -src[1] * r_det;
	dst[2] = -src[2] * r_det;
	dst[3] = src[0] * r_det;
	dst[4] = -src[4] * dst[0] - src[5] * dst[2];
	dst[5] = -src[4] * dst[1] - src[5] * dst[3];
	return GD_TRUE;
}